

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergefiles.c
# Opt level: O0

econf_err traverse_conf_dirs(econf_file ***key_files,char **config_dirs,size_t *size,char *path,
                            char *config_suffix,char *delim,char *comment,_Bool join_same_entries,
                            _Bool python_style,_func__Bool_char_ptr_void_ptr *callback,
                            void *callback_data)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  char *__dest_00;
  econf_err error;
  char *cp;
  char *fulldir;
  int i;
  _Bool python_style_local;
  _Bool join_same_entries_local;
  char *delim_local;
  char *config_suffix_local;
  char *path_local;
  size_t *size_local;
  char **config_dirs_local;
  econf_file ***key_files_local;
  
  if (config_dirs == (char **)0x0) {
    key_files_local._4_4_ = ECONF_NOFILE;
  }
  else {
    fulldir._0_4_ = 0;
    do {
      if (config_dirs[(int)fulldir] == (char *)0x0) {
        return ECONF_SUCCESS;
      }
      sVar1 = strlen(path);
      sVar2 = strlen(config_dirs[(int)fulldir]);
      __dest = (char *)malloc(sVar1 + sVar2 + 1);
      if (__dest == (char *)0x0) {
        return ECONF_NOMEM;
      }
      __dest_00 = stpcpy(__dest,path);
      stpcpy(__dest_00,config_dirs[(int)fulldir]);
      key_files_local._4_4_ =
           check_conf_dir(key_files,size,__dest,config_suffix,delim,comment,join_same_entries,
                          python_style,callback,callback_data);
      free(__dest);
      fulldir._0_4_ = (int)fulldir + 1;
    } while (key_files_local._4_4_ == ECONF_SUCCESS);
  }
  return key_files_local._4_4_;
}

Assistant:

econf_err traverse_conf_dirs(econf_file ***key_files,
			     char *config_dirs[],
			     size_t *size, const char *path,
			     const char *config_suffix,
			     const char *delim, const char *comment,
	                     const bool join_same_entries, const bool python_style,
			     bool (*callback)(const char *filename, const void *data),
			     const void *callback_data) {
  int i;

  if (config_dirs == NULL)
    return ECONF_NOFILE;

  i = 0;
  while (config_dirs[i] != NULL) {
    char *fulldir, *cp;

    if ((fulldir = malloc (strlen(path) + strlen (config_dirs[i]) + 1)) == NULL)
      return ECONF_NOMEM;

    cp = stpcpy (fulldir, path);
    stpcpy (cp, config_dirs[i++]);
    econf_err error = check_conf_dir(key_files, size,
				     fulldir, config_suffix, delim, comment,
	                             join_same_entries, python_style,
				     callback, callback_data);
    free (fulldir);
    if (error)
      return error;
  }
  return ECONF_SUCCESS;
}